

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::concat_sub_tree<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::tree_node<int,_false>_> *left_node,
          uint32_t left_shift,ref<immutable::rrb_details::tree_node<int,_false>_> *right_node,
          uint32_t right_shift,bool is_top)

{
  ref<immutable::rrb_details::internal_node<int,_false>_> **__s;
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  internal_node<int,_false> *__ptr;
  rrb_size_table<false> *prVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char *__function;
  internal_node<int,_false> *__ptr_00;
  uint uVar7;
  ref<immutable::rrb_details::internal_node<int,_false>_> left_internal;
  ref<immutable::rrb_details::tree_node<int,_false>_> left_node_temp;
  ref<immutable::rrb_details::internal_node<int,_false>_> centre_node;
  ref<immutable::rrb_details::internal_node<int,_false>_> empty;
  ref<immutable::rrb_details::internal_node<int,_false>_> centre_node_2;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_68;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_58;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_50;
  internal_node<int,_false> *local_48;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_40;
  size_t local_38;
  
  if (right_shift < left_shift) {
    local_68.ptr = (internal_node<int,_false> *)left_node->ptr;
    if (local_68.ptr != (internal_node<int,_false> *)0x0) {
      (local_68.ptr)->_ref_count = (local_68.ptr)->_ref_count + 1;
      local_60.ptr = (local_68.ptr)->child[(local_68.ptr)->len - 1].ptr;
      if (local_60.ptr != (internal_node<int,_false> *)0x0) {
        (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
      }
      concat_sub_tree<int,false,6>
                ((rrb_details *)&local_58,
                 (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60,left_shift - 6,
                 right_node,right_shift,false);
      local_50.ptr = (internal_node<int,_false> *)0x0;
      rebalance<int,false,6>(this,&local_68,&local_58,&local_50,left_shift,is_top);
      release<int>(local_50.ptr);
      release<int>(local_58.ptr);
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
      release<int>(local_68.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_false>_>)
             (internal_node<int,_false> *)this;
    }
  }
  else if (left_shift < right_shift) {
    local_68.ptr = (internal_node<int,_false> *)right_node->ptr;
    if (local_68.ptr != (internal_node<int,_false> *)0x0) {
      (local_68.ptr)->_ref_count = (local_68.ptr)->_ref_count + 1;
      local_60.ptr = (local_68.ptr)->child->ptr;
      if (local_60.ptr != (internal_node<int,_false> *)0x0) {
        (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
      }
      concat_sub_tree<int,false,6>
                ((rrb_details *)&local_58,left_node,left_shift,
                 (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60,right_shift - 6,
                 false);
      local_50.ptr = (internal_node<int,_false> *)0x0;
      rebalance<int,false,6>(this,&local_50,&local_58,&local_68,right_shift,is_top);
      release<int>(local_50.ptr);
      release<int>(local_58.ptr);
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
      release<int>(local_68.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_false>_>)
             (internal_node<int,_false> *)this;
    }
  }
  else {
    if (left_shift == 0) {
      __ptr_00 = (internal_node<int,_false> *)left_node->ptr;
      if (__ptr_00 != (internal_node<int,_false> *)0x0) {
        __ptr_00->_ref_count = __ptr_00->_ref_count + 1;
      }
      __ptr = (internal_node<int,_false> *)right_node->ptr;
      if (__ptr != (internal_node<int,_false> *)0x0) {
        __ptr->_ref_count = __ptr->_ref_count + 1;
      }
      if (is_top) {
        if ((__ptr_00 == (internal_node<int,_false> *)0x0) ||
           (__ptr == (internal_node<int,_false> *)0x0)) {
          __function = 
          "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
          ;
          goto LAB_001466a2;
        }
        uVar1 = __ptr_00->len;
        uVar2 = __ptr->len;
        uVar7 = uVar2 + uVar1;
        if (uVar7 < 0x41) {
          local_38 = (size_t)(uVar7 * 4);
          local_48 = __ptr_00;
          local_68.ptr = (internal_node<int,_false> *)malloc(local_38 + 0x18);
          (local_68.ptr)->len = uVar7;
          (local_68.ptr)->type = LEAF_NODE;
          __s = &(local_68.ptr)->child;
          ((local_68.ptr)->size_table).ptr = (rrb_size_table<false> *)__s;
          (local_68.ptr)->guid = 0;
          if (uVar7 != 0) {
            memset(__s,0,local_38);
          }
          if ((ulong)uVar1 != 0) {
            prVar4 = (local_48->size_table).ptr;
            uVar6 = 0;
            do {
              *(undefined4 *)((long)__s + uVar6 * 4) =
                   *(undefined4 *)((long)&prVar4->size + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar1 != uVar6);
          }
          if ((ulong)uVar2 != 0) {
            prVar4 = (__ptr->size_table).ptr;
            uVar6 = 0;
            do {
              *(undefined4 *)((long)__s + (ulong)((int)uVar6 + uVar1) * 4) =
                   *(undefined4 *)((long)&prVar4->size + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          (local_68.ptr)->_ref_count = 1;
          puVar5 = (undefined8 *)malloc(0x28);
          *puVar5 = 0x100000001;
          puVar5[2] = 0;
          *(undefined4 *)((long)puVar5 + 0xc) = 0;
          puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4);
          puVar5[4] = 0;
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4),
                     &local_68);
          *(undefined8 **)this = puVar5;
          *(undefined4 *)(puVar5 + 1) = 1;
          release<int>(local_68.ptr);
          __ptr_00 = local_48;
          goto LAB_00146646;
        }
LAB_001465ba:
        __ptr_00->_ref_count = __ptr_00->_ref_count + 1;
      }
      else if (__ptr_00 != (internal_node<int,_false> *)0x0) goto LAB_001465ba;
      if (__ptr != (internal_node<int,_false> *)0x0) {
        __ptr->_ref_count = __ptr->_ref_count + 1;
      }
      local_68.ptr = __ptr_00;
      local_60.ptr = __ptr;
      puVar5 = (undefined8 *)malloc(0x30);
      *puVar5 = 0x200000001;
      puVar5[2] = 0;
      *(undefined4 *)((long)puVar5 + 0xc) = 0;
      puVar5[3] = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4);
      puVar5[4] = 0;
      puVar5[5] = 0;
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5 + 4),&local_68);
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(puVar5[3] + 8),
                 &local_60);
      *(undefined8 **)this = puVar5;
      *(undefined4 *)(puVar5 + 1) = 1;
      release<int>(local_60.ptr);
      release<int>(local_68.ptr);
LAB_00146646:
      if ((__ptr != (internal_node<int,_false> *)0x0) &&
         (uVar3 = __ptr->_ref_count, __ptr->_ref_count = uVar3 - 1, uVar3 == 1)) {
        free(__ptr);
      }
      if ((__ptr_00 != (internal_node<int,_false> *)0x0) &&
         (uVar3 = __ptr_00->_ref_count, __ptr_00->_ref_count = uVar3 - 1, uVar3 == 1)) {
        free(__ptr_00);
      }
      return (ref<immutable::rrb_details::internal_node<int,_false>_>)
             (internal_node<int,_false> *)this;
    }
    local_68.ptr = (internal_node<int,_false> *)left_node->ptr;
    if (local_68.ptr != (internal_node<int,_false> *)0x0) {
      (local_68.ptr)->_ref_count = (local_68.ptr)->_ref_count + 1;
    }
    local_60.ptr = (internal_node<int,_false> *)right_node->ptr;
    if (local_60.ptr != (internal_node<int,_false> *)0x0) {
      (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
    }
    if (local_68.ptr != (internal_node<int,_false> *)0x0) {
      local_58.ptr = (local_68.ptr)->child[(local_68.ptr)->len - 1].ptr;
      if (local_58.ptr != (internal_node<int,_false> *)0x0) {
        (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
      }
      if (local_60.ptr != (internal_node<int,_false> *)0x0) {
        local_50.ptr = (local_60.ptr)->child->ptr;
        if (local_50.ptr != (internal_node<int,_false> *)0x0) {
          (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
        }
        concat_sub_tree<int,false,6>
                  ((rrb_details *)&local_40,
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_58,left_shift - 6,
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50,right_shift - 6,
                   false);
        rebalance<int,false,6>(this,&local_68,&local_40,&local_60,left_shift,is_top);
        release<int>(local_40.ptr);
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50);
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_58);
        release<int>(local_60.ptr);
        release<int>(local_68.ptr);
        return (ref<immutable::rrb_details::internal_node<int,_false>_>)
               (internal_node<int,_false> *)this;
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
  ;
LAB_001466a2:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> concat_sub_tree(const ref<tree_node<T, atomic_ref_counting>>& left_node, uint32_t left_shift, const ref<tree_node<T, atomic_ref_counting>>& right_node, uint32_t right_shift, bool is_top)
      {
      if (left_shift > right_shift)
        {
        // Left tree is higher than right tree
        ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
        ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node, right_shift, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, empty, left_shift, is_top);
        }
      else if (left_shift < right_shift)
        {
        ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
        ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node, left_shift, right_node_temp, right_shift - bits<N>::rrb_bits, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(empty, centre_node, right_internal, right_shift, is_top);
        }
      else
        { // we have same height
        if (left_shift == 0)
          { // We're dealing with leaf nodes
          ref<leaf_node<T, atomic_ref_counting>> left_leaf = left_node;
          ref<leaf_node<T, atomic_ref_counting>> right_leaf = right_node;
          // We don't do this if we're not at top, as we'd have to zip stuff above
          // as well.
          if (is_top && (left_leaf->len + right_leaf->len) <= bits<N>::rrb_branching)
            {
            // Can put them in a single node
            ref<internal_node<T, atomic_ref_counting>> merged = leaf_node_merge<T, atomic_ref_counting>(left_leaf.ptr, right_leaf.ptr);
            return internal_node_new_above1(merged);
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
            ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
            return internal_node_new_above(left_internal, right_internal);
            }
          }
        else
          { // two internal nodes with same height. Move both down
          ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
          ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
          ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
          ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
          ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node_temp, right_shift - bits<N>::rrb_bits, false);
          // can be optimised: since left_shift == right_shift, we'll end up in this
          // block again.
          return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, right_internal, left_shift, is_top);
          }
        }
      }